

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BinTree.h
# Opt level: O0

void __thiscall
axl::sl::
BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
::xcg(BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
      *this,RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *node1,
     RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *node2)

{
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar1;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar2;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar3;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *in_RDX;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *in_RSI;
  long in_RDI;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *oldRight;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *oldLeft;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *oldParent;
  
  pRVar1 = (in_RSI->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_parent;
  pRVar2 = (in_RSI->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_left;
  pRVar3 = (in_RSI->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_right;
  if (in_RSI == (in_RDX->
                super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                ).m_left) {
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = in_RDX;
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = (in_RDX->
                super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                ).m_right;
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = (in_RDX->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_parent;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = pRVar2;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = pRVar3;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = in_RSI;
  }
  else if (in_RSI == (in_RDX->
                     super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                     ).m_right) {
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = (in_RDX->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_left;
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = in_RDX;
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = (in_RDX->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_parent;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = pRVar2;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = pRVar3;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = in_RSI;
  }
  else if (in_RDX == (in_RSI->
                     super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                     ).m_left) {
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = (in_RDX->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_left;
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = (in_RDX->
                super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                ).m_right;
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = in_RDX;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = in_RSI;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = pRVar3;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = pRVar1;
  }
  else if (in_RDX == (in_RSI->
                     super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                     ).m_right) {
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = (in_RDX->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_left;
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = (in_RDX->
                super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                ).m_right;
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = in_RDX;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = pRVar2;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = in_RSI;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = pRVar1;
  }
  else {
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = (in_RDX->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_left;
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = (in_RDX->
                super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                ).m_right;
    (in_RSI->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = (in_RDX->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_parent;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = pRVar2;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = pRVar3;
    (in_RDX->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = pRVar1;
  }
  if ((in_RSI->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_parent == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    *(RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> **)(in_RDI + 0x18) = in_RSI;
  }
  else if ((((in_RSI->
             super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
             ).m_parent)->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_left == in_RDX) {
    (((in_RSI->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_parent)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = in_RSI;
  }
  else {
    (((in_RSI->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_parent)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = in_RSI;
  }
  if ((in_RDX->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_parent == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    *(RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> **)(in_RDI + 0x18) = in_RDX;
  }
  else if ((((in_RDX->
             super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
             ).m_parent)->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_left == in_RSI) {
    (((in_RDX->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_parent)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_left = in_RDX;
  }
  else {
    (((in_RDX->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_parent)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_right = in_RDX;
  }
  if ((in_RSI->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_left != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    (((in_RSI->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_left)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = in_RSI;
  }
  if ((in_RSI->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_right != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    (((in_RSI->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_right)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = in_RSI;
  }
  if ((in_RDX->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_left != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    (((in_RDX->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_left)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = in_RDX;
  }
  if ((in_RDX->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_right != (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    (((in_RDX->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).m_right)->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).m_parent = in_RDX;
  }
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>::onXcg(in_RSI,in_RDX);
  return;
}

Assistant:

void
	xcg(
		Node* node1,
		Node* node2
	) {
		Node* oldParent = node1->m_parent;
		Node* oldLeft = node1->m_left;
		Node* oldRight = node1->m_right;

		// special cases: direct parent-child relations

		if (node1 == node2->m_left) {
			node1->m_left = node2;
			node1->m_right = node2->m_right;
			node1->m_parent = node2->m_parent;

			node2->m_left = oldLeft;
			node2->m_right = oldRight;
			node2->m_parent = node1;
		} else if (node1 == node2->m_right) {
			node1->m_left = node2->m_left;
			node1->m_right = node2;
			node1->m_parent = node2->m_parent;

			node2->m_left = oldLeft;
			node2->m_right = oldRight;
			node2->m_parent = node1;
		} else if (node2 == node1->m_left) {
			node1->m_left = node2->m_left;
			node1->m_right = node2->m_right;
			node1->m_parent = node2;

			node2->m_left = node1;
			node2->m_right = oldRight;
			node2->m_parent = oldParent;
		} else if (node2 == node1->m_right) {
			node1->m_left = node2->m_left;
			node1->m_right = node2->m_right;
			node1->m_parent = node2;

			node2->m_left = oldLeft;
			node2->m_right = node1;
			node2->m_parent = oldParent;
		} else {
			node1->m_left = node2->m_left;
			node1->m_right = node2->m_right;
			node1->m_parent = node2->m_parent;

			node2->m_left = oldLeft;
			node2->m_right = oldRight;
			node2->m_parent = oldParent;
		}

		// fixup parents

		if (!node1->m_parent)
			m_root = node1;
		else if (node1->m_parent->m_left == node2)
			node1->m_parent->m_left = node1;
		else
			node1->m_parent->m_right = node1;

		if (!node2->m_parent)
			m_root = node2;
		else if (node2->m_parent->m_left == node1)
			node2->m_parent->m_left = node2;
		else
			node2->m_parent->m_right = node2;

		// fixup children

		if (node1->m_left)
			node1->m_left->m_parent = node1;

		if (node1->m_right)
			node1->m_right->m_parent = node1;

		if (node2->m_left)
			node2->m_left->m_parent = node2;

		if (node2->m_right)
			node2->m_right->m_parent = node2;

		Node::onXcg(node1, node2);
	}